

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O0

int pay(int choice,int num,double income)

{
  code *pcVar1;
  ostream *poVar2;
  int local_34;
  int local_30;
  int isok;
  int detection;
  int signal;
  double input;
  double pr;
  double income_local;
  int num_local;
  int choice_local;
  
  input = ITEM[choice].price * (double)num;
  _detection = 0.0;
  pr = income;
  income_local._0_4_ = num;
  income_local._4_4_ = choice;
  if (isVIP) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Since you are our VIP, you got 25% off!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    input = input * 0.75;
  }
  local_34 = 1;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Please pay ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,input);
  poVar2 = std::operator<<(poVar2," yuan");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  do {
    std::istream::operator>>((istream *)&std::cin,(double *)&detection);
    pr = _detection + pr;
    if ((pr <= input) || (balance < pr - input)) {
      if (pr - input <= balance) {
        if ((pr != input) || (NAN(pr) || NAN(input))) {
          if (pr < input) {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "Sorry! The money you paid is not enough! Please pay more!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            local_34 = -1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "-------------------------------------------------------------------------"
                                  );
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<(poVar2,"back");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          deal(1,&pr,&balance,input);
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "-------------------------------------------------------------------------"
                                  );
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          buttonback();
          local_30 = deal(1,&pr,&balance,input);
          local_34 = 0;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "-------------------------------------------------------------------------"
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Sorry, there\'s not enough balance in the machine!");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"Refunding...Please wait...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "-------------------------------------------------------------------------"
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        deal(-1,&pr,&balance,input);
        local_30 = deal(-1,&pr,&balance,input);
        local_34 = 0;
      }
    }
    else {
      local_30 = deal(0,&pr,&balance,input);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"back");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      deliver(0,income_local._4_4_,income_local._0_4_);
      local_34 = 0;
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      buttonback();
    }
  } while (local_34 == -1);
  if (local_30 != local_34) {
    detect(999);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_34;
}

Assistant:

int pay(int choice, int num, double income) { //�����ɹ�����0�����󷵻�-1
    double pr = ITEM[choice].price * num, input = 0;
    if (isVIP) {
        cout << "Since you are our VIP, you got 25% off!" << endl;
        pr *= 3.0 / 4;
    }
    int signal, detection, isok = 1;
    frame
    cout << "Please pay " << pr << " yuan" << endl;
    frame
    do {
        cin >> input;
        income += input;
        if (income > pr && income - pr <= balance) {
            signal = 0;
            detection = deal(signal, income, balance, pr);
            frame
            cout << "Payment is successful! Thank you!" << endl << endl << endl << "back" << endl;
            deliver(signal, choice, num);
            isok = 0;
            frame
            buttonback();

        } else if (income - pr > balance) {
            frame
            cout << "Sorry, there's not enough balance in the machine!" << endl << "Refunding...Please wait..." << endl;
            frame
            signal = -1;
            deal(signal, income, balance, pr);
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income == pr) {
            frame
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            signal = 1;
            deal(signal, income, balance, pr);
            frame
            buttonback();
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income < pr) {
            cout << "Sorry! The money you paid is not enough! Please pay more!" << endl;
            isok = -1;
            /*int button = 1;
          if (button == 2) {
                signal = -1;
                detection = deal(signal, income, balance, pr);
                break;
            }*/
        }
    } while (isok == -1);
    if (detection == isok) {
        return isok;
    } else {
        detect(999);
    }
}